

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

void __thiscall
kj::anon_unknown_36::HttpClientAdapter::ConnectResponseImpl::~ConnectResponseImpl
          (ConnectResponseImpl *this)

{
  PromiseFulfiller<kj::HttpClient::ConnectRequest::Status> *pPVar1;
  PromiseFulfiller<void> *pPVar2;
  int iVar3;
  char (*in_RCX) [70];
  Exception ex;
  Array<char> AStack_358;
  Exception local_340;
  Exception local_1b0;
  
  iVar3 = (*(((this->fulfiller).ptr)->super_PromiseRejector)._vptr_PromiseRejector[1])();
  if ((char)iVar3 == '\0') {
    iVar3 = (*(((this->streamAndFulfiller).fulfiller.ptr)->super_PromiseRejector).
              _vptr_PromiseRejector[1])();
    if ((char)iVar3 == '\0') goto LAB_00330e58;
  }
  kj::_::Debug::makeDescription<char_const(&)[70]>
            ((String *)&AStack_358,
             (Debug *)"\"service\'s connect() implementation never called accept() nor reject()\"",
             "service\'s connect() implementation never called accept() nor reject()",in_RCX);
  Exception::Exception
            (&local_340,FAILED,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x1bca,(String *)&AStack_358);
  Array<char>::~Array(&AStack_358);
  iVar3 = (*(((this->fulfiller).ptr)->super_PromiseRejector)._vptr_PromiseRejector[1])();
  if ((char)iVar3 != '\0') {
    pPVar1 = (this->fulfiller).ptr;
    Exception::Exception(&local_1b0,&local_340);
    (**(pPVar1->super_PromiseRejector)._vptr_PromiseRejector)(pPVar1,&local_1b0);
    Exception::~Exception(&local_1b0);
  }
  iVar3 = (*(((this->streamAndFulfiller).fulfiller.ptr)->super_PromiseRejector).
            _vptr_PromiseRejector[1])();
  if ((char)iVar3 != '\0') {
    pPVar2 = (this->streamAndFulfiller).fulfiller.ptr;
    (**(pPVar2->super_PromiseRejector)._vptr_PromiseRejector)(pPVar2,&local_340);
  }
  Exception::~Exception(&local_340);
LAB_00330e58:
  StreamsAndFulfiller::~StreamsAndFulfiller(&this->streamAndFulfiller);
  Own<kj::PromiseFulfiller<kj::HttpClient::ConnectRequest::Status>,_std::nullptr_t>::dispose
            (&this->fulfiller);
  Refcounted::~Refcounted(&this->super_Refcounted);
  return;
}

Assistant:

~ConnectResponseImpl() noexcept(false) {
      if (fulfiller->isWaiting() || streamAndFulfiller.fulfiller->isWaiting()) {
        auto ex = KJ_EXCEPTION(FAILED,
            "service's connect() implementation never called accept() nor reject()");
        if (fulfiller->isWaiting()) {
          fulfiller->reject(kj::cp(ex));
        }
        if (streamAndFulfiller.fulfiller->isWaiting()) {
          streamAndFulfiller.fulfiller->reject(kj::mv(ex));
        }
      }
    }